

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O2

void __thiscall crnlib::Resampler::resample_y(Resampler *this,Sample *Pdst)

{
  int *piVar1;
  float fVar2;
  ushort uVar3;
  Sample *Psrc;
  Contrib *pCVar4;
  int i;
  int iVar5;
  long lVar6;
  long lVar7;
  Resampler *this_00;
  Contrib_List *pCVar8;
  ulong uVar9;
  Sample *Psrc_00;
  
  Psrc_00 = Pdst;
  if (this->m_delay_x_resample != false) {
    Psrc_00 = this->m_Ptmp_buf;
  }
  pCVar8 = this->m_Pclist_y + this->m_cur_dst_y;
  this_00 = this;
  for (uVar9 = 0; uVar9 < pCVar8->n; uVar9 = uVar9 + 1) {
    for (lVar6 = 0;
        (lVar6 != 0x4000 && (this->m_Pscan_buf->scan_buf_y[lVar6] != (uint)pCVar8->p[uVar9].pixel));
        lVar6 = lVar6 + 1) {
    }
    Psrc = this->m_Pscan_buf->scan_buf_l[lVar6];
    pCVar4 = pCVar8->p;
    if (uVar9 == 0) {
      fVar2 = pCVar4->weight;
      lVar7 = 0;
      for (iVar5 = this->m_intermediate_x; 0 < iVar5; iVar5 = iVar5 + -1) {
        *(float *)((long)Psrc_00 + lVar7) = *(float *)((long)Psrc + lVar7) * fVar2;
        lVar7 = lVar7 + 4;
      }
    }
    else {
      scale_y_add(this_00,Psrc_00,Psrc,pCVar4[uVar9].weight,this->m_intermediate_x);
      pCVar4 = pCVar8->p;
    }
    uVar3 = pCVar4[uVar9].pixel;
    piVar1 = this->m_Psrc_y_count + uVar3;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      this->m_Psrc_y_flag[uVar3] = '\0';
      this->m_Pscan_buf->scan_buf_y[lVar6] = -1;
    }
  }
  if (this->m_delay_x_resample == true) {
    resample_x(this,Pdst,Psrc_00);
  }
  if (this->m_lo <= this->m_hi && this->m_hi != this->m_lo) {
    clamp(this,Pdst,this->m_resample_dst_x);
    return;
  }
  return;
}

Assistant:

void Resampler::resample_y(Sample* Pdst)
    {
        int i, j;
        Sample* Psrc;
        Contrib_List* Pclist = &m_Pclist_y[m_cur_dst_y];

        Sample* Ptmp = m_delay_x_resample ? m_Ptmp_buf : Pdst;
        resampler_assert(Ptmp);

        /* Process each contributor. */

        for (i = 0; i < Pclist->n; i++)
        {
            /* locate the contributor's location in the scan
         * buffer -- the contributor must always be found!
         */

            for (j = 0; j < MAX_SCAN_BUF_SIZE; j++)
            {
                if (m_Pscan_buf->scan_buf_y[j] == Pclist->p[i].pixel)
                {
                    break;
                }
            }

            resampler_assert(j < MAX_SCAN_BUF_SIZE);

            Psrc = m_Pscan_buf->scan_buf_l[j];

            if (!i)
            {
                scale_y_mov(Ptmp, Psrc, Pclist->p[i].weight, m_intermediate_x);
            }
            else
            {
                scale_y_add(Ptmp, Psrc, Pclist->p[i].weight, m_intermediate_x);
            }

            /* If this source line doesn't contribute to any
         * more destination lines then mark the scanline buffer slot
         * which holds this source line as free.
         * (The max. number of slots used depends on the Y
         * axis sampling factor and the scaled filter width.)
         */

            if (--m_Psrc_y_count[resampler_range_check(Pclist->p[i].pixel, m_resample_src_y)] == 0)
            {
                m_Psrc_y_flag[resampler_range_check(Pclist->p[i].pixel, m_resample_src_y)] = FALSE;
                m_Pscan_buf->scan_buf_y[j] = -1;
            }
        }

        /* Now generate the destination line */

        if (m_delay_x_resample) // Was X resampling delayed until after Y resampling?
        {
            resampler_assert(Pdst != Ptmp);
            resample_x(Pdst, Ptmp);
        }
        else
        {
            resampler_assert(Pdst == Ptmp);
        }

        if (m_lo < m_hi)
        {
            clamp(Pdst, m_resample_dst_x);
        }
    }